

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZlibWriter.cpp
# Opt level: O3

bool __thiscall ZlibWriter::flush(ZlibWriter *this)

{
  pointer *ppuVar1;
  uInt uVar2;
  iterator __position;
  uint uVar3;
  Bytef *__args;
  ulong uVar4;
  long lVar5;
  bool bVar6;
  uint8_t zchunk [16384];
  Bytef local_4038 [16392];
  
  bVar6 = true;
  if (this->zbuf_changed == true) {
    (this->z).next_in = (Bytef *)0x0;
    (this->z).avail_in = 0;
    do {
      (this->z).next_out = local_4038;
      (this->z).avail_out = 0x4000;
      uVar3 = deflate(&this->z,4);
      bVar6 = uVar3 < 2;
      if (!bVar6) {
        return bVar6;
      }
      uVar2 = (this->z).avail_out;
      if (uVar2 != 0x4000) {
        uVar4 = (ulong)(0x4000 - uVar2);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
                  (&this->zbuf,
                   (size_type)
                   ((this->zbuf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish +
                   (uVar4 - (long)(this->zbuf).
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start)));
        lVar5 = uVar4 + (uVar4 == 0);
        __args = local_4038;
        do {
          __position._M_current =
               (this->zbuf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this->zbuf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_char,std::allocator<unsigned_char>>::
            _M_realloc_insert<unsigned_char_const&>
                      ((vector<unsigned_char,std::allocator<unsigned_char>> *)&this->zbuf,__position
                       ,__args);
          }
          else {
            *__position._M_current = *__args;
            ppuVar1 = &(this->zbuf).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            *ppuVar1 = *ppuVar1 + 1;
          }
          __args = __args + 1;
          lVar5 = lVar5 + -1;
        } while (lVar5 != 0);
      }
    } while (uVar3 != 1);
    this->zbuf_changed = false;
  }
  return bVar6;
}

Assistant:

bool ZlibWriter::flush() const
{
	if (!zbuf_changed)
	{
		return true;
	}

	int zresult;
	uint8_t zchunk[ZLIB_CHUNK_SIZE];

	z.next_in = Z_NULL;
	z.avail_in = 0;
	do
	{
		z.next_out = zchunk;
		z.avail_out = ZLIB_CHUNK_SIZE;

		zresult = deflate(&z, Z_FINISH);
		if (zresult != Z_OK && zresult != Z_STREAM_END)
		{
			return false;
		}

		size_t bytes_written = ZLIB_CHUNK_SIZE - z.avail_out;
		if (bytes_written != 0)
		{
			zbuf.reserve(zbuf.size() + bytes_written);
			for (size_t i = 0; i < bytes_written; i++)
			{
				zbuf.push_back(zchunk[i]);
			}
		}
	} while (zresult != Z_STREAM_END);

	zbuf_changed = false;
	return true;
}